

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O2

void __thiscall ByteData256_Concat_Test::TestBody(ByteData256_Concat_Test *this)

{
  bool bVar1;
  char *message;
  string local_b8;
  AssertionResult gtest_ar;
  AssertHelper local_88;
  ByteData result;
  ByteData256 data3;
  ByteData160 data2;
  ByteData data1;
  ByteData256 base;
  
  std::__cxx11::string::string
            ((string *)&local_b8,"1111111111111111111111111111111111111111111111111111111111111111",
             (allocator *)&data1);
  cfd::core::ByteData256::ByteData256(&base,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"2233",(allocator *)&data2);
  cfd::core::ByteData::ByteData(&data1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string
            ((string *)&local_b8,"4444444444444444444444444444444444444444",(allocator *)&data3);
  cfd::core::ByteData160::ByteData160(&data2,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string
            ((string *)&local_b8,"5555555555555555555555555555555555555555555555555555555555555555",
             (allocator *)&result);
  cfd::core::ByteData256::ByteData256(&data3,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cfd::core::ByteData::ByteData(&result);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::
      Concat<cfd::core::ByteData,cfd::core::ByteData160,cfd::core::ByteData256>
                ((ByteData *)&local_b8,&base,&data1,&data2,&data3);
      cfd::core::ByteData::operator=(&result,(ByteData *)&local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0xa2,
               "Expected: result = base.Concat(data1, data2, data3) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b8,&result);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"result.GetHex().c_str()",
             "\"1111111111111111111111111111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555\""
             ,local_b8._M_dataplus._M_p,
             "1111111111111111111111111111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555"
            );
  std::__cxx11::string::~string((string *)&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata256.cpp"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&result);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&base);
  return;
}

Assistant:

TEST(ByteData256, Concat) {
  ByteData256 base("1111111111111111111111111111111111111111111111111111111111111111");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData result;

  EXPECT_NO_THROW(result = base.Concat(data1, data2, data3));
  EXPECT_STREQ(result.GetHex().c_str(), "1111111111111111111111111111111111111111111111111111111111111111223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555");
}